

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O2

Mat * __thiscall
ncnn::ModelBin::load(Mat *__return_storage_ptr__,ModelBin *this,int w,int h,int c,int type)

{
  Mat m;
  Mat local_60;
  
  (**this->_vptr_ModelBin)(&local_60,this,(ulong)(uint)(h * w * c),type);
  if ((local_60.data == (void *)0x0) || ((long)local_60.c * local_60.cstep == 0)) {
    Mat::Mat(__return_storage_ptr__,&local_60);
  }
  else {
    Mat::reshape(__return_storage_ptr__,&local_60,w,h,c,(Allocator *)0x0);
  }
  Mat::~Mat(&local_60);
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBin::load(int w, int h, int c, int type) const
{
    Mat m = load(w * h * c, type);
    if (m.empty())
        return m;

    return m.reshape(w, h, c);
}